

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::LightSource
          (ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  Float startTime;
  FileLoc loc_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  char *fmt;
  ParameterDictionary local_808;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_738;
  Transform local_6d8;
  LightSceneEntity local_658;
  AnimatedTransform renderFromLight;
  
  if (this->currentApiState == OptionsBlock) {
    fmt = "Scene description must be inside world block; \"%s\" not allowed. Ignoring.";
  }
  else {
    if (this->currentApiState != Uninitialized) {
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_738,in_RDX);
      ParameterDictionary::ParameterDictionary
                (&dict,&local_738,&this->graphicsState->lightAttributes,
                 this->graphicsState->colorSpace);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_738);
      GetCTM((Transform *)&local_658,this,0);
      startTime = this->transformStartTime;
      GetCTM(&local_6d8,this,1);
      AnimatedTransform::AnimatedTransform
                (&renderFromLight,(Transform *)&local_658,startTime,&local_6d8,
                 this->transformEndTime);
      ParameterDictionary::ParameterDictionary(&local_808,&dict);
      loc_00.filename._M_str = (char *)params.ptr;
      loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_00._16_8_ = params.field_2.fixed[0];
      LightSceneEntity::LightSceneEntity
                (&local_658,name,&local_808,loc_00,&renderFromLight,
                 &this->graphicsState->currentOutsideMedium);
      std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>::
      emplace_back<pbrt::LightSceneEntity>(&this->lights,&local_658);
      LightSceneEntity::~LightSceneEntity(&local_658);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_808.params);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&dict.params);
      return;
    }
    fmt = "pbrtInit() must be before calling \"%s()\". Ignoring.";
  }
  Error<char_const(&)[12]>((FileLoc *)&params,fmt,(char (*) [12])0x593baa);
  return;
}

Assistant:

void ParsedScene::LightSource(const std::string &name, ParsedParameterVector params,
                              FileLoc loc) {
    VERIFY_WORLD("LightSource");
    ParameterDictionary dict(std::move(params), graphicsState->lightAttributes,
                             graphicsState->colorSpace);
    AnimatedTransform renderFromLight(GetCTM(0), transformStartTime, GetCTM(1),
                                      transformEndTime);

    lights.push_back(LightSceneEntity(name, std::move(dict), loc, renderFromLight,
                                      graphicsState->currentOutsideMedium));
}